

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportException
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index except_index,TypeVector *sig)

{
  Module *this_00;
  char *__s;
  Offset OVar1;
  size_t sVar2;
  undefined1 local_78 [8];
  string_view module_name_local;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  string_view field_name_local;
  long local_30;
  unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_> import;
  
  field_name_local.data_ = (char *)field_name.size_;
  local_48 = (undefined1  [8])field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  local_78 = (undefined1  [8])module_name.data_;
  MakeUnique<wabt::ExceptionImport>();
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_78);
  std::__cxx11::string::operator=((string *)(local_30 + 8),(string *)&module_name_local.size_);
  if ((undefined1 *)module_name_local.size_ != local_58) {
    operator_delete((void *)module_name_local.size_);
  }
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_48);
  std::__cxx11::string::operator=((string *)(local_30 + 0x28),(string *)&module_name_local.size_);
  if ((undefined1 *)module_name_local.size_ != local_58) {
    operator_delete((void *)module_name_local.size_);
  }
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_30 + 0x70),sig);
  this_00 = this->module_;
  __s = this->filename_;
  sVar2 = strlen(__s);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  field_name_local.size_ = (size_type)operator_new(0x48);
  *(undefined8 *)(field_name_local.size_ + 8) = 0;
  *(undefined8 *)(field_name_local.size_ + 0x10) = 0;
  *(char **)(field_name_local.size_ + 0x18) = __s;
  *(size_t *)(field_name_local.size_ + 0x20) = sVar2;
  *(Offset *)(field_name_local.size_ + 0x28) = OVar1;
  *(undefined8 *)(field_name_local.size_ + 0x30) = 0;
  *(undefined4 *)(field_name_local.size_ + 0x38) = 2;
  *(undefined ***)field_name_local.size_ = &PTR__ImportModuleField_0155b118;
  *(long *)(field_name_local.size_ + 0x40) = local_30;
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&field_name_local.size_);
  if (field_name_local.size_ != 0) {
    (**(code **)(*(long *)field_name_local.size_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportException(Index import_index,
                                         string_view module_name,
                                         string_view field_name,
                                         Index except_index,
                                         TypeVector& sig) {
  auto import = MakeUnique<ExceptionImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->except.sig = sig;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}